

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithNoErrorsTestingOffsets::
~TestCharReaderTestparseWithNoErrorsTestingOffsets
          (TestCharReaderTestparseWithNoErrorsTestingOffsets *this)

{
  void *in_RDI;
  
  ~TestCharReaderTestparseWithNoErrorsTestingOffsets
            ((TestCharReaderTestparseWithNoErrorsTestingOffsets *)0x16bd78);
  operator_delete(in_RDI);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
                         "{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}